

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O3

int read_ident(C_Parser *tokenizer,char *start)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  char *p;
  char *q;
  char *local_28;
  char *local_20;
  
  local_28 = start;
  uVar2 = C_decode_utf8(tokenizer,&local_28,start);
  _Var1 = C_is_ident1(uVar2);
  iVar3 = 0;
  if (_Var1) {
    uVar2 = C_decode_utf8(tokenizer,&local_20,local_28);
    _Var1 = C_is_ident2(uVar2);
    if (_Var1) {
      do {
        local_28 = local_20;
        uVar2 = C_decode_utf8(tokenizer,&local_20,local_20);
        _Var1 = C_is_ident2(uVar2);
      } while (_Var1);
    }
    iVar3 = (int)local_28 - (int)start;
  }
  return iVar3;
}

Assistant:

static int read_ident(C_Parser *tokenizer, char *start) {
  char *p = start;
  uint32_t c = C_decode_utf8(tokenizer, &p, p);
  if (!C_is_ident1(c))
    return 0;

  for (;;) {
    char *q;
    c = C_decode_utf8(tokenizer, &q, p);
    if (!C_is_ident2(c))
      return p - start;
    p = q;
  }
}